

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  InternalRunDeathTestFlag *pIVar3;
  bool bVar4;
  int iVar5;
  __pid_t _Var6;
  UnitTest *pUVar7;
  long *plVar8;
  undefined8 *puVar9;
  void *__addr;
  int *piVar10;
  size_type *psVar11;
  unsigned_long *puVar12;
  _func_void *p_Var13;
  ulong *puVar14;
  long lVar15;
  undefined8 uVar16;
  pointer pbVar17;
  pointer ppcVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  _Alloc_hider _Var19;
  size_t __len;
  pointer local_300;
  ExecDeathTestArgs args_2;
  sigaction ignore_sigprof_action;
  string filter_flag;
  string internal_flag;
  sigaction saved_sigprof_action;
  undefined1 auStack_178 [4];
  int death_test_index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 auStack_158 [8];
  vector<char_*,_std::allocator<char_*>_> argv;
  int local_138;
  int local_134;
  int pipe_fd [2];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pUVar7 = UnitTest::GetInstance();
  pIVar3 = (pUVar7->impl_->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  saved_sigprof_action.sa_restorer._4_4_ =
       (pUVar7->impl_->current_test_info_->result_).death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  do {
    iVar5 = pipe(&local_138);
    bVar4 = IsTrue(iVar5 != -1);
    if (!bVar4) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CHECK failed: File ","");
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
        local_b0.field_2._M_allocated_capacity = *psVar11;
        local_b0.field_2._8_8_ = plVar8[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar11;
      }
      local_b0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_50._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
        local_50.field_2._M_allocated_capacity = *psVar11;
        local_50.field_2._8_8_ = plVar8[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar11;
      }
      local_50._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_f0._M_dataplus._M_p._0_4_ = 0x557;
      StreamableToString<int>(&local_d0,(int *)&local_f0);
      std::operator+(&local_70,&local_50,&local_d0);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
      args_2._8_8_ = *plVar8;
      puVar12 = (unsigned_long *)(plVar8 + 2);
      if ((unsigned_long *)args_2._8_8_ == puVar12) {
        ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
        ignore_sigprof_action.sa_mask.__val[1] = plVar8[3];
        args_2._8_8_ = &ignore_sigprof_action.sa_mask;
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
      *plVar8 = (long)puVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&args_2.close_fd);
      internal_flag.field_2._8_8_ = *plVar8;
      puVar12 = (unsigned_long *)(plVar8 + 2);
      if ((unsigned_long *)internal_flag.field_2._8_8_ == puVar12) {
        saved_sigprof_action.sa_mask.__val[0] = *puVar12;
        saved_sigprof_action.sa_mask.__val[1] = plVar8[3];
        internal_flag.field_2._8_8_ = &saved_sigprof_action.sa_mask;
      }
      else {
        saved_sigprof_action.sa_mask.__val[0] = *puVar12;
      }
      saved_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
      *plVar8 = (long)puVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
    }
    bVar4 = AlwaysTrue();
  } while (!bVar4);
  do {
    iVar5 = fcntl(local_134,2,0);
    bVar4 = IsTrue(iVar5 != -1);
    if (!bVar4) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CHECK failed: File ","");
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
        local_b0.field_2._M_allocated_capacity = *psVar11;
        local_b0.field_2._8_8_ = plVar8[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar11;
      }
      local_b0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_50._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
        local_50.field_2._M_allocated_capacity = *psVar11;
        local_50.field_2._8_8_ = plVar8[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar11;
      }
      local_50._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_f0._M_dataplus._M_p._0_4_ = 0x55a;
      StreamableToString<int>(&local_d0,(int *)&local_f0);
      std::operator+(&local_70,&local_50,&local_d0);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
      args_2._8_8_ = *plVar8;
      puVar12 = (unsigned_long *)(plVar8 + 2);
      if ((unsigned_long *)args_2._8_8_ == puVar12) {
        ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
        ignore_sigprof_action.sa_mask.__val[1] = plVar8[3];
        args_2._8_8_ = &ignore_sigprof_action.sa_mask;
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
      *plVar8 = (long)puVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&args_2.close_fd);
      internal_flag.field_2._8_8_ = *plVar8;
      puVar12 = (unsigned_long *)(plVar8 + 2);
      if ((unsigned_long *)internal_flag.field_2._8_8_ == puVar12) {
        saved_sigprof_action.sa_mask.__val[0] = *puVar12;
        saved_sigprof_action.sa_mask.__val[1] = plVar8[3];
        internal_flag.field_2._8_8_ = &saved_sigprof_action.sa_mask;
      }
      else {
        saved_sigprof_action.sa_mask.__val[0] = *puVar12;
      }
      saved_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
      *plVar8 = (long)puVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
    }
    bVar4 = AlwaysTrue();
  } while (!bVar4);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"--","");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_50.field_2._M_allocated_capacity = *psVar11;
    local_50.field_2._8_8_ = plVar8[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar11;
    local_50._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_50._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_70.field_2._M_allocated_capacity = *psVar11;
    local_70.field_2._8_8_ = plVar8[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar11;
    local_70._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_70._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  args_2._8_8_ = &ignore_sigprof_action.sa_mask;
  puVar12 = (unsigned_long *)(plVar8 + 2);
  if ((unsigned_long *)*plVar8 == puVar12) {
    ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
    ignore_sigprof_action.sa_mask.__val[1] = plVar8[3];
  }
  else {
    ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
    args_2._8_8_ = (unsigned_long *)*plVar8;
  }
  ignore_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&args_2.close_fd);
  internal_flag.field_2._8_8_ = &saved_sigprof_action.sa_mask;
  puVar12 = (unsigned_long *)(plVar8 + 2);
  if ((unsigned_long *)*plVar8 == puVar12) {
    saved_sigprof_action.sa_mask.__val[0] = *puVar12;
    saved_sigprof_action.sa_mask.__val[1] = plVar8[3];
  }
  else {
    saved_sigprof_action.sa_mask.__val[0] = *puVar12;
    internal_flag.field_2._8_8_ = (unsigned_long *)*plVar8;
  }
  saved_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(internal_flag.field_2._M_local_buf + 8);
  ignore_sigprof_action.sa_restorer = (_func_void *)&filter_flag._M_string_length;
  p_Var13 = (_func_void *)(plVar8 + 2);
  if ((_func_void *)*plVar8 == p_Var13) {
    filter_flag._M_string_length = *(size_type *)p_Var13;
    filter_flag.field_2._M_allocated_capacity = plVar8[3];
  }
  else {
    filter_flag._M_string_length = *(size_type *)p_Var13;
    ignore_sigprof_action.sa_restorer = (_func_void *)*plVar8;
  }
  filter_flag._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)p_Var13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((__sigset_t *)internal_flag.field_2._8_8_ != &saved_sigprof_action.sa_mask) {
    operator_delete((void *)internal_flag.field_2._8_8_,saved_sigprof_action.sa_mask.__val[0] + 1);
  }
  if ((__sigset_t *)args_2._8_8_ != &ignore_sigprof_action.sa_mask) {
    operator_delete((void *)args_2._8_8_,ignore_sigprof_action.sa_mask.__val[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"--","");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_f0.field_2._M_allocated_capacity = *psVar11;
    local_f0.field_2._8_8_ = plVar8[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar11;
    local_f0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_f0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0.field_2._8_8_ = plVar8[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_90.field_2._M_allocated_capacity = *psVar11;
    local_90.field_2._8_8_ = plVar8[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar11;
    local_90._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_90._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar14 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_b0.field_2._M_allocated_capacity = *puVar14;
    local_b0.field_2._8_8_ = plVar8[3];
    local_b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *puVar14;
    local_b0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_b0._M_string_length = plVar8[1];
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  StreamableToString<int>((string *)pipe_fd,&this->line_);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    uVar16 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_128 + local_b0._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
      uVar16 = local_120._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_128 + local_b0._M_string_length) goto LAB_001300a4;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
  }
  else {
LAB_001300a4:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b0,CONCAT44(pipe_fd[1],pipe_fd[0]));
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_50.field_2._M_allocated_capacity = *psVar11;
    local_50.field_2._8_8_ = puVar9[3];
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar11;
    local_50._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_50._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  puVar14 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_70.field_2._M_allocated_capacity = *puVar14;
    local_70.field_2._8_8_ = plVar8[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *puVar14;
    local_70._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_70._M_string_length = plVar8[1];
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  StreamableToString<int>
            ((string *)auStack_178,(int *)((long)&saved_sigprof_action.sa_restorer + 4));
  pbVar2 = (pointer)((long)&((args.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                    local_70._M_string_length);
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    uVar16 = local_70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < pbVar2) {
    pbVar17 = (pointer)0xf;
    if ((pointer *)_auStack_178 !=
        &args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar17 = args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pbVar17 < pbVar2) goto LAB_001301b7;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)auStack_178,0,(char *)0x0,(ulong)local_70._M_dataplus._M_p);
  }
  else {
LAB_001301b7:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)_auStack_178);
  }
  args_2._8_8_ = &ignore_sigprof_action.sa_mask;
  puVar12 = puVar9 + 2;
  if ((unsigned_long *)*puVar9 == puVar12) {
    ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
    ignore_sigprof_action.sa_mask.__val[1] = puVar9[3];
  }
  else {
    ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
    args_2._8_8_ = (unsigned_long *)*puVar9;
  }
  ignore_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(puVar9 + 1);
  *puVar9 = puVar12;
  puVar9[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&args_2.close_fd);
  internal_flag.field_2._8_8_ = &saved_sigprof_action.sa_mask;
  puVar12 = (unsigned_long *)(plVar8 + 2);
  if ((unsigned_long *)*plVar8 == puVar12) {
    saved_sigprof_action.sa_mask.__val[0] = *puVar12;
    saved_sigprof_action.sa_mask.__val[1] = plVar8[3];
  }
  else {
    saved_sigprof_action.sa_mask.__val[0] = *puVar12;
    internal_flag.field_2._8_8_ = (unsigned_long *)*plVar8;
  }
  saved_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  StreamableToString<int>((string *)auStack_158,&local_134);
  ppcVar18 = (pointer)0xf;
  if ((__sigset_t *)internal_flag.field_2._8_8_ != &saved_sigprof_action.sa_mask) {
    ppcVar18 = (pointer)saved_sigprof_action.sa_mask.__val[0];
  }
  if (ppcVar18 <
      (pointer)((long)argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start +
               (long)saved_sigprof_action.__sigaction_handler.sa_handler)) {
    ppcVar18 = (pointer)0xf;
    if (auStack_158 !=
        (undefined1  [8])
        &argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
      ppcVar18 = argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    }
    if (ppcVar18 <
        (pointer)((long)argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start +
                 (long)saved_sigprof_action.__sigaction_handler.sa_handler)) goto LAB_001302f7;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)auStack_158,0,(char *)0x0,internal_flag.field_2._8_8_);
  }
  else {
LAB_001302f7:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (internal_flag.field_2._M_local_buf + 8,(ulong)auStack_158);
  }
  filter_flag.field_2._8_8_ = &internal_flag._M_string_length;
  psVar11 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar11) {
    internal_flag._M_string_length = *psVar11;
    internal_flag.field_2._M_allocated_capacity = puVar9[3];
  }
  else {
    internal_flag._M_string_length = *psVar11;
    filter_flag.field_2._8_8_ = (size_type *)*puVar9;
  }
  internal_flag._M_dataplus._M_p = (pointer)puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  if (auStack_158 !=
      (undefined1  [8])
      &argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
       _M_finish) {
    operator_delete((void *)auStack_158,
                    (long)argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1);
  }
  if ((__sigset_t *)internal_flag.field_2._8_8_ != &saved_sigprof_action.sa_mask) {
    operator_delete((void *)internal_flag.field_2._8_8_,saved_sigprof_action.sa_mask.__val[0] + 1);
  }
  if ((__sigset_t *)args_2._8_8_ != &ignore_sigprof_action.sa_mask) {
    operator_delete((void *)args_2._8_8_,ignore_sigprof_action.sa_mask.__val[0] + 1);
  }
  if ((pointer *)_auStack_178 !=
      &args.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(_auStack_178,
                    (ulong)((long)&((args.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(pipe_fd[1],pipe_fd[0]),local_120._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  GetInjectableArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_178,(value_type *)&ignore_sigprof_action.sa_restorer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_178,(value_type *)((long)&filter_flag.field_2 + 8));
  internal_flag.field_2._8_8_ = &saved_sigprof_action.sa_mask;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&internal_flag.field_2 + 8),"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((__sigset_t *)internal_flag.field_2._8_8_ != &saved_sigprof_action.sa_mask) {
    operator_delete((void *)internal_flag.field_2._8_8_,saved_sigprof_action.sa_mask.__val[0] + 1);
  }
  CaptureStderr();
  fflush((FILE *)0x0);
  auStack_158 = (undefined1  [8])0x0;
  argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::vector<char_*,_std::allocator<char_*>_>::reserve
            ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,
             ((long)args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)_auStack_178 >> 5) + 1);
  if ((pointer)_auStack_178 !=
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    _Var19._M_p = _auStack_178;
    do {
      internal_flag.field_2._8_8_ = (((pointer)_Var19._M_p)->_M_dataplus)._M_p;
      std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                ((vector<char*,std::allocator<char*>> *)auStack_158,
                 (char **)((long)&internal_flag.field_2 + 8));
      _Var19._M_p = _Var19._M_p + 0x20;
    } while ((pointer)_Var19._M_p !=
             args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  internal_flag.field_2._8_8_ = 0;
  std::vector<char*,std::allocator<char*>>::emplace_back<char*>
            ((vector<char*,std::allocator<char*>> *)auStack_158,
             (char **)((long)&internal_flag.field_2 + 8));
  local_300 = (pointer)auStack_158;
  args_2.argv._0_4_ = local_138;
  memset(&args_2.close_fd,0,0x98);
  sigemptyset((sigset_t *)&ignore_sigprof_action);
  args_2.close_fd = 1;
  args_2._12_4_ = 0;
  do {
    while (iVar5 = sigaction(0x1b,(sigaction *)&args_2.close_fd,
                             (sigaction *)((long)&internal_flag.field_2 + 8)), iVar5 == -1) {
      piVar10 = __errno_location();
      if (*piVar10 != 4) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"CHECK failed: File ","");
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_f0._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_f0._M_dataplus._M_p == psVar11) {
          local_f0.field_2._M_allocated_capacity = *psVar11;
          local_f0.field_2._8_8_ = plVar8[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar11;
        }
        local_f0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_d0._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
          local_d0.field_2._M_allocated_capacity = *psVar11;
          local_d0.field_2._8_8_ = plVar8[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar11;
        }
        local_d0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        saved_sigprof_action.sa_restorer._0_4_ = 0x515;
        StreamableToString<int>((string *)pipe_fd,(int *)&saved_sigprof_action.sa_restorer);
        std::operator+(&local_90,&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd)
        ;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_b0._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
          local_b0.field_2._M_allocated_capacity = *psVar11;
          local_b0.field_2._8_8_ = plVar8[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar11;
        }
        local_b0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_50._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
          local_50.field_2._M_allocated_capacity = *psVar11;
          local_50.field_2._8_8_ = plVar8[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar11;
        }
        local_50._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
          local_70.field_2._M_allocated_capacity = *psVar11;
          local_70.field_2._8_8_ = plVar8[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar11;
        }
        local_70._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        DeathTestAbort(&local_70);
      }
    }
    bVar4 = AlwaysTrue();
  } while (!bVar4);
  if (FLAGS_gtest_death_test_use_fork != '\0') {
    _Var6 = fork();
    if (_Var6 != 0) goto LAB_001307c1;
    ExecDeathTestChildMain(&local_300);
  }
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
    AssumeRole();
  }
  iVar5 = getpagesize();
  __len = (size_t)(iVar5 * 2);
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
  do {
    bVar4 = IsTrue(__addr != (void *)0xffffffffffffffff);
    if (!bVar4) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_90._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar11) {
        local_90.field_2._M_allocated_capacity = *psVar11;
        local_90.field_2._8_8_ = plVar8[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar11;
      }
      local_90._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      pipe_fd[0] = 0x521;
      StreamableToString<int>(&local_110,pipe_fd);
      std::operator+(&local_b0,&local_90,&local_110);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_50._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
        local_50.field_2._M_allocated_capacity = *psVar11;
        local_50.field_2._8_8_ = plVar8[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar11;
      }
      local_50._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
        local_70.field_2._M_allocated_capacity = *psVar11;
        local_70.field_2._8_8_ = plVar8[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar11;
      }
      local_70._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      DeathTestAbort(&local_70);
    }
    bVar4 = AlwaysTrue();
  } while (!bVar4);
  lVar15 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
    lVar15 = __len - 0x40;
  }
  do {
    bVar4 = IsTrue(((ulong)((long)__addr + lVar15) & 0x3f) == 0 && 0x40 < (uint)(iVar5 * 2));
    if (!bVar4) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_90._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar11) {
        local_90.field_2._M_allocated_capacity = *psVar11;
        local_90.field_2._8_8_ = plVar8[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar11;
      }
      local_90._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      pipe_fd[0] = 0x52f;
      StreamableToString<int>(&local_110,pipe_fd);
      std::operator+(&local_b0,&local_90,&local_110);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_50._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
        local_50.field_2._M_allocated_capacity = *psVar11;
        local_50.field_2._8_8_ = plVar8[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar11;
      }
      local_50._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
        local_70.field_2._M_allocated_capacity = *psVar11;
        local_70.field_2._8_8_ = plVar8[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar11;
      }
      local_70._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      DeathTestAbort(&local_70);
    }
    bVar4 = AlwaysTrue();
  } while (!bVar4);
  _Var6 = clone(ExecDeathTestChildMain,(void *)((long)__addr + lVar15),0x11,&local_300);
  do {
    iVar5 = munmap(__addr,__len);
    bVar4 = IsTrue(iVar5 != -1);
    if (!bVar4) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_90._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar11) {
        local_90.field_2._M_allocated_capacity = *psVar11;
        local_90.field_2._8_8_ = plVar8[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar11;
      }
      local_90._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      pipe_fd[0] = 0x533;
      StreamableToString<int>(&local_110,pipe_fd);
      std::operator+(&local_b0,&local_90,&local_110);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_50._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
        local_50.field_2._M_allocated_capacity = *psVar11;
        local_50.field_2._8_8_ = plVar8[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar11;
      }
      local_50._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
        local_70.field_2._M_allocated_capacity = *psVar11;
        local_70.field_2._8_8_ = plVar8[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar11;
      }
      local_70._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      DeathTestAbort(&local_70);
    }
    bVar4 = AlwaysTrue();
  } while (!bVar4);
LAB_001307c1:
  do {
    while (iVar5 = sigaction(0x1b,(sigaction *)((long)&internal_flag.field_2 + 8),(sigaction *)0x0),
          iVar5 == -1) {
      piVar10 = __errno_location();
      if (*piVar10 != 4) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"CHECK failed: File ","");
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_f0._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_f0._M_dataplus._M_p == psVar11) {
          local_f0.field_2._M_allocated_capacity = *psVar11;
          local_f0.field_2._8_8_ = plVar8[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar11;
        }
        local_f0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_d0._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
          local_d0.field_2._M_allocated_capacity = *psVar11;
          local_d0.field_2._8_8_ = plVar8[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar11;
        }
        local_d0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        saved_sigprof_action.sa_restorer._0_4_ = 0x53f;
        StreamableToString<int>((string *)pipe_fd,(int *)&saved_sigprof_action.sa_restorer);
        std::operator+(&local_90,&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd)
        ;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_b0._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
          local_b0.field_2._M_allocated_capacity = *psVar11;
          local_b0.field_2._8_8_ = plVar8[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar11;
        }
        local_b0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_50._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
          local_50.field_2._M_allocated_capacity = *psVar11;
          local_50.field_2._8_8_ = plVar8[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar11;
        }
        local_50._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
          local_70.field_2._M_allocated_capacity = *psVar11;
          local_70.field_2._8_8_ = plVar8[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar11;
        }
        local_70._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        DeathTestAbort(&local_70);
      }
    }
    bVar4 = AlwaysTrue();
  } while (!bVar4);
  do {
    bVar4 = IsTrue(_Var6 != -1);
    if (!bVar4) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_90._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar11) {
        local_90.field_2._M_allocated_capacity = *psVar11;
        local_90.field_2._8_8_ = plVar8[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar11;
      }
      local_90._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      pipe_fd[0] = 0x542;
      StreamableToString<int>(&local_110,pipe_fd);
      std::operator+(&local_b0,&local_90,&local_110);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_50._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
        local_50.field_2._M_allocated_capacity = *psVar11;
        local_50.field_2._8_8_ = plVar8[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar11;
      }
      local_50._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)*plVar8;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
        local_70.field_2._M_allocated_capacity = *psVar11;
        local_70.field_2._8_8_ = plVar8[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar11;
      }
      local_70._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      DeathTestAbort(&local_70);
    }
    bVar4 = AlwaysTrue();
  } while (!bVar4);
  do {
    while (iVar5 = close(local_134), iVar5 == -1) {
      piVar10 = __errno_location();
      if (*piVar10 != 4) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"CHECK failed: File ","");
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_90._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar11) {
          local_90.field_2._M_allocated_capacity = *psVar11;
          local_90.field_2._8_8_ = plVar8[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar11;
        }
        local_90._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_b0._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
          local_b0.field_2._M_allocated_capacity = *psVar11;
          local_b0.field_2._8_8_ = plVar8[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar11;
        }
        local_b0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_110._M_dataplus._M_p._0_4_ = 0x571;
        StreamableToString<int>(&local_f0,(int *)&local_110);
        std::operator+(&local_50,&local_b0,&local_f0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70._M_dataplus._M_p = (pointer)*plVar8;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_70._M_dataplus._M_p == psVar11) {
          local_70.field_2._M_allocated_capacity = *psVar11;
          local_70.field_2._8_8_ = plVar8[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar11;
        }
        local_70._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
        args_2._8_8_ = *plVar8;
        puVar12 = (unsigned_long *)(plVar8 + 2);
        if ((unsigned_long *)args_2._8_8_ == puVar12) {
          ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
          ignore_sigprof_action.sa_mask.__val[1] = plVar8[3];
          args_2._8_8_ = &ignore_sigprof_action.sa_mask;
        }
        else {
          ignore_sigprof_action.sa_mask.__val[0] = *puVar12;
        }
        ignore_sigprof_action.__sigaction_handler =
             *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
        *plVar8 = (long)puVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&args_2.close_fd);
        internal_flag.field_2._8_8_ = *plVar8;
        puVar12 = (unsigned_long *)(plVar8 + 2);
        if ((unsigned_long *)internal_flag.field_2._8_8_ == puVar12) {
          saved_sigprof_action.sa_mask.__val[0] = *puVar12;
          saved_sigprof_action.sa_mask.__val[1] = plVar8[3];
          internal_flag.field_2._8_8_ = &saved_sigprof_action.sa_mask;
        }
        else {
          saved_sigprof_action.sa_mask.__val[0] = *puVar12;
        }
        saved_sigprof_action.__sigaction_handler =
             *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
        *plVar8 = (long)puVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
      }
    }
    bVar4 = AlwaysTrue();
  } while (!bVar4);
  *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var6;
  (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_138;
  (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
  if (auStack_158 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_158,
                    (long)argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_158);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_178);
  if ((size_type *)filter_flag.field_2._8_8_ != &internal_flag._M_string_length) {
    operator_delete((void *)filter_flag.field_2._8_8_,internal_flag._M_string_length + 1);
  }
  if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
    operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
  }
  return OVERSEE_TEST;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::vector<char*> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.data(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}